

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

TriggerPrg * getRowTrigger(Parse *pParse,Trigger *pTrigger,Table *pTab,int orconf)

{
  undefined4 uVar1;
  undefined4 uVar2;
  sqlite3 *db;
  sqlite3 *db_00;
  Vdbe *p;
  int *piVar3;
  VdbeOp *pVVar4;
  u8 uVar5;
  int iVar6;
  uint dest;
  TriggerPrg *pTVar7;
  SubProgram *pSVar8;
  Parse *pParse_00;
  Vdbe *pVVar9;
  char *pcVar10;
  Expr *pEVar11;
  SrcList *pSVar12;
  ExprList *pChanges;
  IdList *pColumn;
  Select *pSVar13;
  TriggerStep *pStep;
  Parse *pPVar14;
  undefined1 local_88 [20];
  undefined4 local_74;
  undefined1 local_68 [24];
  undefined1 local_50 [16];
  undefined1 local_40 [16];
  
  pPVar14 = pParse->pToplevel;
  if (pParse->pToplevel == (Parse *)0x0) {
    pPVar14 = pParse;
  }
  for (pTVar7 = pPVar14->pTriggerPrg; pTVar7 != (TriggerPrg *)0x0; pTVar7 = pTVar7->pNext) {
    if ((pTVar7->pTrigger == pTrigger) && (pTVar7->orconf == orconf)) {
      return pTVar7;
    }
  }
  db = pParse->db;
  pTVar7 = (TriggerPrg *)sqlite3DbMallocZero(db,0x28);
  if (pTVar7 == (TriggerPrg *)0x0) {
    return (TriggerPrg *)0x0;
  }
  pTVar7->pNext = pPVar14->pTriggerPrg;
  pPVar14->pTriggerPrg = pTVar7;
  pSVar8 = (SubProgram *)sqlite3DbMallocZero(db,0x30);
  pTVar7->pProgram = pSVar8;
  if (pSVar8 == (SubProgram *)0x0) {
    return (TriggerPrg *)0x0;
  }
  pVVar9 = pPVar14->pVdbe;
  pSVar8->pNext = pVVar9->pProgram;
  pVVar9->pProgram = pSVar8;
  pTVar7->pTrigger = pTrigger;
  pTVar7->orconf = orconf;
  pTVar7->aColmask[0] = 0xffffffff;
  pTVar7->aColmask[1] = 0xffffffff;
  pParse_00 = (Parse *)sqlite3DbMallocZero(db,0x250);
  if (pParse_00 == (Parse *)0x0) {
    return (TriggerPrg *)0x0;
  }
  local_40 = (undefined1  [16])0x0;
  local_50 = (undefined1  [16])0x0;
  local_68._8_16_ = (undefined1  [16])0x0;
  pParse_00->db = db;
  pParse_00->pTriggerTab = pTab;
  pParse_00->pToplevel = pPVar14;
  pcVar10 = pTrigger->zName;
  pParse_00->zAuthContext = pcVar10;
  pParse_00->eTriggerOp = pTrigger->op;
  pParse_00->nQueryLoop = pParse->nQueryLoop;
  pVVar9 = pParse_00->pVdbe;
  local_68._0_8_ = pParse_00;
  if (pVVar9 == (Vdbe *)0x0) {
    pVVar9 = allocVdbe(pParse_00);
    if (pVVar9 == (Vdbe *)0x0) goto LAB_0024da41;
    pcVar10 = pTrigger->zName;
  }
  dest = 0;
  pcVar10 = sqlite3MPrintf(db,"-- TRIGGER %s",pcVar10);
  sqlite3VdbeChangeP4(pVVar9,-1,pcVar10,-7);
  if (pTrigger->pWhen != (Expr *)0x0) {
    dest = 0;
    pEVar11 = exprDup(db,pTrigger->pWhen,0,(u8 **)0x0);
    iVar6 = sqlite3ResolveExprNames((NameContext *)local_68,pEVar11);
    if ((iVar6 == 0) && (db->mallocFailed == '\0')) {
      dest = sqlite3VdbeMakeLabel((Vdbe *)pVVar9->pParse);
      sqlite3ExprIfFalse(pParse_00,pEVar11,dest,0x10);
    }
    if (pEVar11 != (Expr *)0x0) {
      sqlite3ExprDeleteNN(db,pEVar11);
    }
  }
  pStep = pTrigger->step_list;
  if (pStep != (TriggerStep *)0x0) {
    db_00 = pParse_00->db;
    p = pParse_00->pVdbe;
    do {
      uVar5 = (u8)orconf;
      if (orconf == 10) {
        uVar5 = pStep->orconf;
      }
      pParse_00->eOrconf = uVar5;
      uVar5 = pStep->op;
      if (uVar5 == 'l') {
        pSVar12 = targetSrcList((Parse *)pParse_00->db,pStep);
        pSVar13 = sqlite3SelectDup(db_00,pStep->pSelect,0);
        pColumn = sqlite3IdListDup(db_00,pStep->pIdList);
        sqlite3Insert(pParse_00,pSVar12,pSVar13,pColumn,(uint)pParse_00->eOrconf);
      }
      else if (uVar5 == 'm') {
        pSVar12 = targetSrcList((Parse *)pParse_00->db,pStep);
        if (pStep->pWhere == (Expr *)0x0) {
          pEVar11 = (Expr *)0x0;
        }
        else {
          pEVar11 = exprDup(db_00,pStep->pWhere,0,(u8 **)0x0);
        }
        sqlite3DeleteFrom(pParse_00,pSVar12,pEVar11);
      }
      else if (uVar5 == 'n') {
        pSVar12 = targetSrcList((Parse *)pParse_00->db,pStep);
        pChanges = sqlite3ExprListDup(db_00,pStep->pExprList,0);
        if (pStep->pWhere == (Expr *)0x0) {
          pEVar11 = (Expr *)0x0;
        }
        else {
          pEVar11 = exprDup(db_00,pStep->pWhere,0,(u8 **)0x0);
        }
        sqlite3Update(pParse_00,pSVar12,pChanges,pEVar11,(uint)pParse_00->eOrconf);
      }
      else {
        pSVar13 = sqlite3SelectDup(db_00,pStep->pSelect,0);
        local_88[0] = '\x04';
        local_88._4_16_ = (undefined1  [16])0x0;
        local_74 = 0;
        sqlite3Select(pParse_00,pSVar13,(SelectDest *)local_88);
        if (pSVar13 != (Select *)0x0) {
          clearSelect(db_00,pSVar13,1);
        }
      }
      if (pStep->op != 'w') {
        sqlite3VdbeAddOp3(p,0x77,0,0,0);
      }
      pStep = pStep->pNext;
    } while (pStep != (TriggerStep *)0x0);
  }
  if ((dest != 0) && (piVar3 = pVVar9->pParse->aLabel, piVar3 != (int *)0x0)) {
    piVar3[(int)~dest] = pVVar9->nOp;
  }
  sqlite3VdbeAddOp3(pVVar9,0x37,0,0,0);
  pcVar10 = pParse_00->zErrMsg;
  if (pParse->nErr == 0) {
    pParse->zErrMsg = pcVar10;
    pParse->nErr = pParse_00->nErr;
    pParse->rc = pParse_00->rc;
  }
  else if (pcVar10 != (char *)0x0) {
    sqlite3DbFreeNN(pParse_00->db,pcVar10);
  }
  if (db->mallocFailed == '\0') {
    pVVar4 = pVVar9->aOp;
    resolveP2Values(pVVar9,&pPVar14->nMaxArg);
    pSVar8->nOp = pVVar9->nOp;
    pVVar9->aOp = (Op *)0x0;
    pSVar8->aOp = pVVar4;
  }
  uVar1 = pParse_00->nTab;
  uVar2 = pParse_00->nMem;
  pSVar8->nMem = uVar2;
  pSVar8->nCsr = uVar1;
  pSVar8->token = pTrigger;
  pTVar7->aColmask[0] = pParse_00->oldmask;
  pTVar7->aColmask[1] = pParse_00->newmask;
  sqlite3VdbeDelete(pVVar9);
LAB_0024da41:
  sqlite3ParserReset(pParse_00);
  sqlite3DbFreeNN(db,pParse_00);
  return pTVar7;
}

Assistant:

static TriggerPrg *getRowTrigger(
  Parse *pParse,       /* Current parse context */
  Trigger *pTrigger,   /* Trigger to code */
  Table *pTab,         /* The table trigger pTrigger is attached to */
  int orconf           /* ON CONFLICT algorithm. */
){
  Parse *pRoot = sqlite3ParseToplevel(pParse);
  TriggerPrg *pPrg;

  assert( pTrigger->zName==0 || pTab==tableOfTrigger(pTrigger) );

  /* It may be that this trigger has already been coded (or is in the
  ** process of being coded). If this is the case, then an entry with
  ** a matching TriggerPrg.pTrigger field will be present somewhere
  ** in the Parse.pTriggerPrg list. Search for such an entry.  */
  for(pPrg=pRoot->pTriggerPrg; 
      pPrg && (pPrg->pTrigger!=pTrigger || pPrg->orconf!=orconf); 
      pPrg=pPrg->pNext
  );

  /* If an existing TriggerPrg could not be located, create a new one. */
  if( !pPrg ){
    pPrg = codeRowTrigger(pParse, pTrigger, pTab, orconf);
  }

  return pPrg;
}